

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

timer_id_t __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
schedule_timer(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
               *this,type_index *type_wrapper,message_ref_t *msg,mbox_t *mbox,duration pause,
              duration period)

{
  pthread_mutex_t *__mutex;
  undefined8 in_stack_00000008;
  
  __mutex = (pthread_mutex_t *)(type_wrapper + 2);
  std::mutex::lock((mutex *)&__mutex->__data);
  (**(code **)(*(long *)type_wrapper[0x24]._M_target + 0x20))
            (this,type_wrapper[0x24]._M_target,msg,pause.__r,mbox,period.__r,in_stack_00000008);
  wakeup_if_waiting((main_thread_sync_objects_t *)&__mutex->__data);
  pthread_mutex_unlock(__mutex);
  return (timer_id_t)(intrusive_ptr_t<so_5::timer_t>)this;
}

Assistant:

so_5::timer_id_t
env_infrastructure_t< ACTIVITY_TRACKER >::schedule_timer(
	const std::type_index & type_wrapper,
	const message_ref_t & msg,
	const mbox_t & mbox,
	std::chrono::steady_clock::duration pause,
	std::chrono::steady_clock::duration period )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );

		auto timer = m_timer_manager->schedule(
				type_wrapper,
				mbox,
				msg,
				pause,
				period );

		wakeup_if_waiting( m_sync_objects );

		return timer;
	}